

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_invoke_helpers.hpp
# Opt level: O0

void asio_handler_invoke_helpers::
     invoke<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>,asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>>
               (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
                *function,
               binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
               *context)

{
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
  *in_RSI;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1590:9),_std::error_code>
  *in_stack_ffffffffffffffe8;
  
  asio::detail::
  asio_handler_invoke<asio::detail::binder1<tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>,tonk::gateway::HTTPRequester::Begin(tonk::gateway::ParsedURL_const&,tonk::gateway::AsioHost*,std::__cxx11::string_const&,std::function<void(tonk::Result_const&,unsigned_int,char_const*,unsigned_int)>const&)::__0,std::error_code>
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

inline void invoke(Function& function, Context& context)
{
#if !defined(ASIO_HAS_HANDLER_HOOKS)
  Function tmp(function);
  tmp();
#else
  using asio::asio_handler_invoke;
  asio_handler_invoke(function, asio::detail::addressof(context));
#endif
}